

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

uint64_t llvm::hashing::detail::hash_17to32_bytes(char *s,size_t len,uint64_t seed)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t seed_local;
  size_t len_local;
  char *s_local;
  
  uVar1 = fetch64(s);
  uVar2 = fetch64(s + 8);
  uVar3 = fetch64(s + (len - 8));
  uVar4 = fetch64(s + (len - 0x10));
  uVar5 = rotate(uVar1 * -0x4b6d499041670d8d - uVar2,0x2b);
  uVar6 = rotate(uVar3 * -0x651e95c4d06fbfb1 ^ seed,0x1e);
  uVar2 = rotate(uVar2 ^ 0xc949d7c7509e6557,0x14);
  uVar1 = hash_16_bytes(uVar5 + uVar6 + uVar4 * -0x3c5a37a36834ced9,
                        uVar1 * -0x4b6d499041670d8d + uVar2 + uVar3 * 0x651e95c4d06fbfb1 + len +
                        seed);
  return uVar1;
}

Assistant:

inline uint64_t hash_17to32_bytes(const char *s, size_t len, uint64_t seed) {
  uint64_t a = fetch64(s) * k1;
  uint64_t b = fetch64(s + 8);
  uint64_t c = fetch64(s + len - 8) * k2;
  uint64_t d = fetch64(s + len - 16) * k0;
  return hash_16_bytes(rotate(a - b, 43) + rotate(c ^ seed, 30) + d,
                       a + rotate(b ^ k3, 20) - c + len + seed);
}